

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type)

{
  vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *this_00;
  int iVar1;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  __last;
  Option *pOVar2;
  pointer psVar3;
  pointer pbVar4;
  bool bVar5;
  Classifier CVar6;
  HorribleError *pHVar7;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var8;
  App *pAVar9;
  size_t sVar10;
  ArgumentMismatch *__return_storage_ptr__;
  pointer pbVar11;
  pointer psVar12;
  int iVar13;
  int iVar14;
  int result_count;
  int local_300;
  int local_2fc;
  App *local_2f8;
  string res;
  _Head_base<0UL,_CLI::Option_*,_false> local_2c8;
  string rest;
  string arg_name;
  string value;
  string current;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  anon_class_40_2_a297e68f_for__M_pred local_178;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_2f8 = this;
  ::std::__cxx11::string::string
            ((string *)&current,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish + -1));
  arg_name._M_dataplus._M_p = (pointer)&arg_name.field_2;
  arg_name._M_string_length = 0;
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  rest._M_dataplus._M_p = (pointer)&rest.field_2;
  rest._M_string_length = 0;
  arg_name.field_2._M_local_buf[0] = '\0';
  value.field_2._M_local_buf[0] = '\0';
  rest.field_2._M_local_buf[0] = '\0';
  if (current_type == SHORT) {
    bVar5 = detail::split_short(&current,&arg_name,&rest);
    if (!bVar5) {
      pHVar7 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string
                ((string *)&local_b0,"Short parsed but missing! You should not see this",
                 (allocator *)&res);
      HorribleError::HorribleError(pHVar7,&local_b0);
      __cxa_throw(pHVar7,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else if (current_type == WINDOWS) {
    bVar5 = detail::split_windows_style(&current,&arg_name,&value);
    if (!bVar5) {
      pHVar7 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string
                ((string *)&local_d0,"windows option parsed but missing! You should not see this",
                 (allocator *)&res);
      HorribleError::HorribleError(pHVar7,&local_d0);
      __cxa_throw(pHVar7,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else {
    if (current_type != LONG) {
      pHVar7 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string
                ((string *)&local_f0,
                 "parsing got called with invalid option! You should not see this",(allocator *)&res
                );
      HorribleError::HorribleError(pHVar7,&local_f0);
      __cxa_throw(pHVar7,&HorribleError::typeinfo,Error::~Error);
    }
    bVar5 = detail::split_long(&current,&arg_name,&value);
    if (!bVar5) {
      pHVar7 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_90,"Long parsed but missing (you should not see this):",
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + -1);
      HorribleError::HorribleError(pHVar7,&local_90);
      __cxa_throw(pHVar7,&HorribleError::typeinfo,Error::~Error);
    }
  }
  _Var8._M_current =
       (local_2f8->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (local_2f8->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::string((string *)&local_178,(string *)&arg_name);
  local_178.current_type = current_type;
  _Var8 = ::std::
          find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                    (_Var8,__last,&local_178);
  ::std::__cxx11::string::~string((string *)&local_178);
  if (_Var8._M_current ==
      (local_2f8->options_).
      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar3 = (local_2f8->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar12 = (local_2f8->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pAVar9 = local_2f8, psVar12 != psVar3;
        psVar12 = psVar12 + 1) {
      pAVar9 = (psVar12->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((((pAVar9->name_)._M_string_length == 0) && (pAVar9->disabled_ == false)) &&
         (bVar5 = _parse_arg(pAVar9,args,current_type), bVar5)) {
        pAVar9 = (psVar12->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        bVar5 = true;
        if (pAVar9->pre_parse_called_ == false) {
          _trigger_pre_parse(pAVar9,(long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 5);
        }
        goto LAB_00118748;
      }
    }
    if (local_2f8->parent_ != (App *)0x0) {
      if (local_2f8->fallthrough_ == true) {
        pAVar9 = _get_fallthrough_parent(local_2f8);
        bVar5 = _parse_arg(pAVar9,args,current_type);
        goto LAB_00118748;
      }
      if ((local_2f8->name_)._M_string_length == 0) {
        bVar5 = false;
        goto LAB_00118748;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(args);
    bVar5 = true;
    _move_to_missing(pAVar9,current_type,&current);
    goto LAB_00118748;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(args);
  pOVar2 = ((_Var8._M_current)->_M_t).
           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  iVar13 = pOVar2->type_size_min_;
  local_300 = pOVar2->expected_min_ * iVar13;
  if (iVar13 <= local_300) {
    local_300 = iVar13;
  }
  local_2fc = Option::get_items_expected_max(pOVar2);
  pAVar9 = local_2f8;
  result_count = 0;
  if (local_2fc == 0) {
    pOVar2 = ((_Var8._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::__cxx11::string::string((string *)&local_198,(string *)&value);
    Option::get_flag_value(&res,pOVar2,&arg_name,&local_198);
    ::std::__cxx11::string::~string((string *)&local_198);
    pOVar2 = ((_Var8._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::__cxx11::string::string((string *)&local_1b8,(string *)&res);
    Option::add_result(pOVar2,&local_1b8);
    ::std::__cxx11::string::~string((string *)&local_1b8);
    local_2c8._M_head_impl =
         ((_Var8._M_current)->_M_t).
         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
              ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&pAVar9->parse_order_,
               &local_2c8._M_head_impl);
    ::std::__cxx11::string::~string((string *)&res);
LAB_001183ad:
    iVar13 = 0;
  }
  else if (value._M_string_length == 0) {
    if (rest._M_string_length == 0) goto LAB_001183ad;
    pOVar2 = ((_Var8._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::__cxx11::string::string((string *)&local_1f8,(string *)&rest);
    Option::add_result(pOVar2,&local_1f8,&result_count);
    ::std::__cxx11::string::~string((string *)&local_1f8);
    res._M_dataplus._M_p =
         (pointer)((_Var8._M_current)->_M_t).
                  super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                  super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                  super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
              ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&pAVar9->parse_order_,
               (Option **)&res);
    ::std::__cxx11::string::assign((char *)&rest);
    iVar13 = result_count;
  }
  else {
    pOVar2 = ((_Var8._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::__cxx11::string::string((string *)&local_1d8,(string *)&value);
    Option::add_result(pOVar2,&local_1d8,&result_count);
    ::std::__cxx11::string::~string((string *)&local_1d8);
    res._M_dataplus._M_p =
         (pointer)((_Var8._M_current)->_M_t).
                  super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                  super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                  super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
              ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&pAVar9->parse_order_,
               (Option **)&res);
    iVar13 = result_count;
  }
  this_00 = &pAVar9->parse_order_;
  while (pAVar9 = local_2f8, iVar13 < local_300) {
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if ((args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start == pbVar11) {
      __return_storage_ptr__ = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
      Option::get_name_abi_cxx11_
                (&local_110,
                 ((_Var8._M_current)->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
      Option::get_type_name_abi_cxx11_
                (&local_130,
                 ((_Var8._M_current)->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      ArgumentMismatch::TypedAtLeast(__return_storage_ptr__,&local_110,local_300,&local_130);
      __cxa_throw(__return_storage_ptr__,&ArgumentMismatch::typeinfo,Error::~Error);
    }
    ::std::__cxx11::string::string((string *)&res,(string *)(pbVar11 + -1));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(args);
    pOVar2 = ((_Var8._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::__cxx11::string::string((string *)&local_50,(string *)&res);
    Option::add_result(pOVar2,&local_50,&result_count);
    ::std::__cxx11::string::~string((string *)&local_50);
    local_2c8._M_head_impl =
         ((_Var8._M_current)->_M_t).
         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
              ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)this_00,&local_2c8._M_head_impl)
    ;
    iVar13 = iVar13 + result_count;
    ::std::__cxx11::string::~string((string *)&res);
  }
  if ((iVar13 < local_2fc) ||
     (iVar14 = local_300,
     (((_Var8._M_current)->_M_t).
      super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
      super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
      super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ == true)) {
    sVar10 = _count_remaining_positionals(local_2f8,true);
    while ((iVar13 < local_2fc ||
           ((((_Var8._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ != false))
          ) {
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar11 == pbVar4) goto LAB_001185d6;
      CVar6 = _recognize(pAVar9,pbVar4 + -1,false);
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((CVar6 != NONE) ||
         (pbVar4 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,
         (ulong)((long)pbVar4 - (long)pbVar11 >> 5) <= sVar10)) goto LAB_001185d6;
      pOVar2 = ((_Var8._M_current)->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::__cxx11::string::string((string *)&local_70,(string *)(pbVar4 + -1));
      Option::add_result(pOVar2,&local_70,&result_count);
      ::std::__cxx11::string::~string((string *)&local_70);
      res._M_dataplus._M_p =
           (pointer)((_Var8._M_current)->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)this_00,(Option **)&res);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
      iVar13 = iVar13 + result_count;
    }
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
LAB_001185d6:
    iVar14 = local_300;
    pbVar4 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((pbVar11 != pbVar4) &&
       (CVar6 = _recognize(pAVar9,pbVar4 + -1,true), CVar6 == POSITIONAL_MARK)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
    }
    if ((0 < local_2fc) && (iVar13 == 0 && iVar14 == 0)) {
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      local_150._M_string_length = 0;
      local_150.field_2._M_local_buf[0] = '\0';
      Option::get_flag_value
                (&res,((_Var8._M_current)->_M_t).
                      super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                      super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                      super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&arg_name,&local_150)
      ;
      ::std::__cxx11::string::~string((string *)&local_150);
      pOVar2 = ((_Var8._M_current)->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::__cxx11::string::string((string *)&local_218,(string *)&res);
      Option::add_result(pOVar2,&local_218);
      ::std::__cxx11::string::~string((string *)&local_218);
      local_2c8._M_head_impl =
           ((_Var8._M_current)->_M_t).
           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)this_00,
                 &local_2c8._M_head_impl);
      ::std::__cxx11::string::~string((string *)&res);
    }
  }
  if (0 < iVar14) {
    pOVar2 = ((_Var8._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    iVar1 = pOVar2->type_size_max_;
    if ((iVar1 != iVar14) && (iVar13 % iVar1 != 0)) {
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      local_238._M_string_length = 0;
      local_238.field_2._M_local_buf[0] = '\0';
      Option::add_result(pOVar2,&local_238);
      ::std::__cxx11::string::~string((string *)&local_238);
    }
  }
  if (rest._M_string_length != 0) {
    ::std::operator+(&res,"-",&rest);
    ::std::__cxx11::string::operator=((string *)&rest,(string *)&res);
    ::std::__cxx11::string::~string((string *)&res);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(args,&rest);
  }
  bVar5 = true;
LAB_00118748:
  ::std::__cxx11::string::~string((string *)&rest);
  ::std::__cxx11::string::~string((string *)&value);
  ::std::__cxx11::string::~string((string *)&arg_name);
  ::std::__cxx11::string::~string((string *)&current);
  return bVar5;
}

Assistant:

bool _parse_arg(std::vector<std::string> &args, detail::Classifier current_type) {

        std::string current = args.back();

        std::string arg_name;
        std::string value;
        std::string rest;

        switch(current_type) {
        case detail::Classifier::LONG:
            if(!detail::split_long(current, arg_name, value))
                throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
            break;
        case detail::Classifier::SHORT:
            if(!detail::split_short(current, arg_name, rest))
                throw HorribleError("Short parsed but missing! You should not see this");
            break;
        case detail::Classifier::WINDOWS:
            if(!detail::split_windows_style(current, arg_name, value))
                throw HorribleError("windows option parsed but missing! You should not see this");
            break;
        case detail::Classifier::SUBCOMMAND:
        case detail::Classifier::SUBCOMMAND_TERMINATOR:
        case detail::Classifier::POSITIONAL_MARK:
        case detail::Classifier::NONE:
        default:
            throw HorribleError("parsing got called with invalid option! You should not see this");
        }

        auto op_ptr =
            std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
                if(current_type == detail::Classifier::LONG)
                    return opt->check_lname(arg_name);
                if(current_type == detail::Classifier::SHORT)
                    return opt->check_sname(arg_name);
                // this will only get called for detail::Classifier::WINDOWS
                return opt->check_lname(arg_name) || opt->check_sname(arg_name);
            });

        // Option not found
        if(op_ptr == std::end(options_)) {
            for(auto &subc : subcommands_) {
                if(subc->name_.empty() && !subc->disabled_) {
                    if(subc->_parse_arg(args, current_type)) {
                        if(!subc->pre_parse_called_) {
                            subc->_trigger_pre_parse(args.size());
                        }
                        return true;
                    }
                }
            }
            // If a subcommand, try the master command
            if(parent_ != nullptr && fallthrough_)
                return _get_fallthrough_parent()->_parse_arg(args, current_type);
            // don't capture missing if this is a nameless subcommand
            if(parent_ != nullptr && name_.empty()) {
                return false;
            }
            // Otherwise, add to missing
            args.pop_back();
            _move_to_missing(current_type, current);
            return true;
        }

        args.pop_back();

        // Get a reference to the pointer to make syntax bearable
        Option_p &op = *op_ptr;

        int min_num = (std::min)(op->get_type_size_min(), op->get_items_expected_min());
        int max_num = op->get_items_expected_max();

        // Make sure we always eat the minimum for unlimited vectors
        int collected = 0;     // total number of arguments collected
        int result_count = 0;  // local variable for number of results in a single arg string
        // deal with purely flag like things
        if(max_num == 0) {
            auto res = op->get_flag_value(arg_name, value);
            op->add_result(res);
            parse_order_.push_back(op.get());
        } else if(!value.empty()) {  // --this=value
            op->add_result(value, result_count);
            parse_order_.push_back(op.get());
            collected += result_count;
            // -Trest
        } else if(!rest.empty()) {
            op->add_result(rest, result_count);
            parse_order_.push_back(op.get());
            rest = "";
            collected += result_count;
        }

        // gather the minimum number of arguments
        while(min_num > collected && !args.empty()) {
            std::string current_ = args.back();
            args.pop_back();
            op->add_result(current_, result_count);
            parse_order_.push_back(op.get());
            collected += result_count;
        }

        if(min_num > collected) {  // if we have run out of arguments and the minimum was not met
            throw ArgumentMismatch::TypedAtLeast(op->get_name(), min_num, op->get_type_name());
        }

        if(max_num > collected || op->get_allow_extra_args()) {  // we allow optional arguments
            auto remreqpos = _count_remaining_positionals(true);
            // we have met the minimum now optionally check up to the maximum
            while((collected < max_num || op->get_allow_extra_args()) && !args.empty() &&
                  _recognize(args.back(), false) == detail::Classifier::NONE) {
                // If any required positionals remain, don't keep eating
                if(remreqpos >= args.size()) {
                    break;
                }

                op->add_result(args.back(), result_count);
                parse_order_.push_back(op.get());
                args.pop_back();
                collected += result_count;
            }

            // Allow -- to end an unlimited list and "eat" it
            if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
                args.pop_back();
            // optional flag that didn't receive anything now get the default value
            if(min_num == 0 && max_num > 0 && collected == 0) {
                auto res = op->get_flag_value(arg_name, std::string{});
                op->add_result(res);
                parse_order_.push_back(op.get());
            }
        }

        // if we only partially completed a type then add an empty string for later processing
        if(min_num > 0 && op->get_type_size_max() != min_num && collected % op->get_type_size_max() != 0) {
            op->add_result(std::string{});
        }

        if(!rest.empty()) {
            rest = "-" + rest;
            args.push_back(rest);
        }
        return true;
    }